

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O3

int main(int ArgCnt,char **ArgVec)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  void *pvVar12;
  int64_t MshIdx;
  int64_t MshIdx_00;
  char *pcVar13;
  void *pvVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int NmbTyp;
  int NmbNod;
  int deg;
  int dim;
  int InpVer;
  int SolSiz;
  char *TmpStr2;
  char *TmpStr;
  int TokTab [1024];
  int TypTab [1000];
  GrpSct GrpTab [1024];
  undefined4 *in_stack_ffffffffffff5f98;
  undefined4 uVar22;
  uint local_a054;
  uint local_a03c;
  int local_a038 [2];
  char *local_a030;
  int local_a024;
  int local_a020;
  undefined4 local_a01c;
  uint local_a018;
  uint local_a014;
  uint local_a010;
  undefined1 local_a00c [4];
  char **local_a008;
  char *local_a000;
  char *local_9ff8;
  long local_9ff0;
  char *local_9fe8;
  char *local_9fe0;
  int local_9fd8 [1024];
  undefined1 local_8fd8 [4000];
  uint local_8038 [2];
  long local_8030;
  uint local_8028 [2];
  undefined8 local_8020 [4094];
  
  local_a024 = ArgCnt;
  if (ArgCnt == 1) {
    puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
    puts(" Usage    : transmesh source_name destination_name (-options)\n");
    puts(" optional : -v output_file_version");
    puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
    puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
    puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
    puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
    puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
    puts("            Defines a group named \"inflow\" with index 1 that includes");
    puts("            a set of comma-seprated triangle references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
    puts("            Defines a group named \"wings\" with index 3 that excludes");
    puts("            a set of comma-seprated quadrilateral references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    exit(0);
  }
  local_9ff8 = ArgVec[1];
  local_a000 = ArgVec[2];
  iVar7 = strcmp(local_9ff8,local_a000);
  if (iVar7 == 0) {
    puts("The output mesh cannot overwrite the input mesh.");
LAB_00106c8a:
    exit(1);
  }
  uVar17 = 0;
  memset(GmfMaxRefTab,0,0x3c4);
  local_a054 = 0;
  if (3 < local_a024) {
    iVar7 = 3;
    local_a054 = 0;
    uVar17 = 0;
    local_a008 = ArgVec;
    do {
      iVar16 = iVar7 + 1;
      pcVar11 = ArgVec[iVar7];
      if (((*pcVar11 == '-') && (pcVar11[1] == 'v')) && (pcVar11[2] == '\0')) {
        local_a030 = pcVar11;
        local_a054 = atoi(ArgVec[iVar16]);
        if (local_a054 - 5 < 0xfffffffc) {
          printf("Wrong size type : %d\n",(ulong)local_a054);
          goto LAB_00106c8a;
        }
        iVar16 = iVar7 + 2;
        pcVar11 = local_a030;
      }
      iVar7 = strcmp(pcVar11,"-igroup");
      if ((iVar7 == 0) || (iVar8 = strcmp(pcVar11,"-egroup"), iVar7 = iVar16, iVar8 == 0)) {
        lVar10 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        lVar19 = (long)iVar16;
        local_8020[lVar10 * 4] = ArgVec[lVar19];
        local_a030 = pcVar11;
        uVar9 = atoi(ArgVec[lVar19 + 1]);
        local_8038[lVar10 * 8] = uVar9;
        pcVar11 = ArgVec[lVar19 + 2];
        uVar9 = 1;
        lVar20 = 0x18;
        local_9ff0 = lVar19;
        do {
          iVar7 = strcmp(*(char **)((long)GmfKwdFmt[0] + lVar20),pcVar11);
          if (iVar7 == 0) goto LAB_001065a4;
          uVar9 = uVar9 + 1;
          lVar20 = lVar20 + 0x18;
        } while (lVar20 != 0x1698);
        uVar9 = 0;
LAB_001065a4:
        local_8028[lVar10 * 8] = uVar9;
        iVar7 = (int)local_9ff0 + 4;
        local_9fe0 = local_a008[local_9ff0 + 3];
        uVar9 = 0;
        do {
          local_9fe8 = strsep(&local_9fe0,",");
          if (local_9fe8 == (char *)0x0) break;
          piVar18 = local_a038;
          bVar6 = true;
          do {
            bVar5 = bVar6;
            pcVar11 = strsep(&local_9fe8,"-");
            if (pcVar11 == (char *)0x0) {
              if (bVar5) goto LAB_00106c8a;
              lVar19 = (long)(int)uVar9;
              uVar9 = uVar9 + 1;
              local_9fd8[lVar19] = local_a038[0];
              goto LAB_00106676;
            }
            iVar16 = atoi(pcVar11);
            *piVar18 = iVar16;
            piVar18 = &local_a020;
            bVar6 = false;
          } while (bVar5);
          if (local_a038[0] <= local_a020) {
            piVar18 = local_9fd8 + (int)uVar9;
            uVar9 = (local_a020 + uVar9 + 1) - local_a038[0];
            iVar16 = local_a038[0];
            do {
              *piVar18 = iVar16;
              iVar16 = iVar16 + 1;
              piVar18 = piVar18 + 1;
            } while (local_a020 + 1 != iVar16);
          }
LAB_00106676:
        } while ((int)uVar9 < 0x400);
        local_8038[lVar10 * 8 + 1] = uVar9;
        pvVar12 = malloc((long)(int)uVar9 * 4);
        (&local_8030)[lVar10 * 4] = (long)pvVar12;
        if (0 < (int)uVar9) {
          memcpy(pvVar12,local_9fd8,(ulong)uVar9 << 2);
        }
        iVar16 = strcmp(local_a030,"-igroup");
        local_8028[lVar10 * 8 + 1] = -(uint)(iVar16 != 0) | 1;
        ArgVec = local_a008;
      }
    } while (iVar7 < local_a024);
  }
  MshIdx = GmfOpenMesh(local_9ff8,1,&local_a010,&local_a014);
  pcVar11 = local_a000;
  if (MshIdx == 0) {
    main_cold_2();
  }
  else {
    if (local_a054 == 0) {
      local_a054 = local_a010;
    }
    MshIdx_00 = GmfOpenMesh(local_a000,2,(ulong)local_a054,(ulong)local_a014);
    if (MshIdx_00 == 0) {
      main_cold_1();
    }
    else {
      lVar10 = 0;
      do {
        pcVar13 = GmfKwdFmt[lVar10][0];
        iVar7 = strcmp(pcVar13,"Reserved");
        if ((iVar7 != 0) && (iVar7 = strcmp(pcVar13,"End"), iVar7 != 0)) {
          iVar16 = (int)lVar10;
          iVar7 = GmfGotoKwd(MshIdx,iVar16);
          if (iVar7 != 0) {
            uVar9 = (byte)*GmfKwdFmt[lVar10][1] - 0x69;
            if (uVar9 == 0) {
              uVar9 = (uint)(byte)GmfKwdFmt[lVar10][1][1];
            }
            if (uVar9 == 0) {
              pbVar4 = (byte *)GmfKwdFmt[lVar10][2];
              bVar1 = *pbVar4;
              uVar9 = bVar1 - 0x73;
              if ((uVar9 == 0) && (uVar9 = pbVar4[1] - 0x72, uVar9 == 0)) {
                uVar9 = (uint)pbVar4[2];
              }
              if (uVar9 != 0) {
                if (bVar1 == 0x68) {
                  uVar9 = pbVar4[1] - 0x72;
                  if (uVar9 == 0) {
                    uVar9 = (uint)pbVar4[2];
                  }
                  if (uVar9 == 0) {
                    uVar9 = 0;
                    if ((bVar1 == 0x68) && (uVar9 = pbVar4[1] - 0x72, uVar9 == 0)) {
                      uVar9 = (uint)pbVar4[2];
                    }
                    if (uVar9 == 0) {
                      in_stack_ffffffffffff5f98 = &local_a01c;
                      pcVar11 = (char *)GmfStatKwd(MshIdx,iVar16,&local_a03c,local_a00c,local_8fd8,
                                                   &local_a018,in_stack_ffffffffffff5f98);
                      if (pcVar11 == (char *)0x0) goto LAB_00106973;
                      in_stack_ffffffffffff5f98 =
                           (undefined4 *)
                           CONCAT44((int)((ulong)in_stack_ffffffffffff5f98 >> 0x20),local_a01c);
                      GmfSetKwd(MshIdx_00,iVar16,(int64_t)pcVar11,(ulong)local_a03c,local_8fd8,
                                (ulong)local_a018,in_stack_ffffffffffff5f98);
                    }
                    goto LAB_00106867;
                  }
                }
                pcVar13 = (char *)GmfStatKwd(MshIdx,iVar16);
                pcVar11 = pcVar13;
                if (pcVar13 == (char *)0x0) goto LAB_001068a0;
                goto LAB_00106860;
              }
              pcVar11 = (char *)GmfStatKwd(MshIdx,iVar16,&local_a03c,local_a00c,local_8fd8);
              if (pcVar11 == (char *)0x0) {
LAB_00106973:
                pcVar11 = (char *)0x0;
                goto LAB_001068a2;
              }
              GmfSetKwd(MshIdx_00,iVar16,(int64_t)pcVar11,(ulong)local_a03c,local_8fd8);
            }
            else {
              pcVar11 = (char *)GmfStatKwd(MshIdx,iVar16);
              if (pcVar11 == (char *)0x0) {
LAB_001068a0:
                pcVar11 = (char *)0x0;
                goto LAB_001068a2;
              }
              pcVar13 = (char *)0x0;
LAB_00106860:
              GmfSetKwd(MshIdx_00,iVar16,(int64_t)pcVar13);
            }
LAB_00106867:
            printf("Parsing %s : %ld item\n",GmfKwdFmt[lVar10][0],pcVar11);
            if (0 < (long)pcVar11) {
              lVar19 = 0;
              do {
                GmfCpyLin(MshIdx,MshIdx_00,iVar16);
                lVar19 = lVar19 + 1;
              } while (lVar19 < (long)pcVar11);
            }
          }
        }
LAB_001068a2:
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0xf1);
      local_a030 = (char *)MshIdx;
      if (uVar17 != 0) {
        GmfSetKwd(MshIdx_00,0x5e,(long)(int)uVar17);
        if ((int)uVar17 < 1) {
          GmfSetKwd(MshIdx_00,0x5f,0);
        }
        else {
          iVar7 = 1;
          uVar9 = 0;
          do {
            uVar22 = (undefined4)((ulong)in_stack_ffffffffffff5f98 >> 0x20);
            lVar10 = (long)(int)uVar9;
            uVar2 = local_8028[lVar10 * 8];
            if (local_8028[lVar10 * 8 + 1] == 0xffffffff) {
              uVar3 = GmfMaxRefTab[(int)uVar2];
              if (GmfMaxRefTab[(int)uVar2] == 0) {
                uVar3 = 0x400;
              }
              uVar9 = uVar3 + 1;
              pvVar12 = malloc((long)(int)uVar9);
              if (0 < (int)uVar3) {
                memset((void *)((long)pvVar12 + 1),1,(ulong)uVar3);
              }
              uVar21 = local_8038[lVar10 * 8 + 1];
              pvVar14 = (void *)(&local_8030)[lVar10 * 4];
              if (0 < (long)(int)uVar21) {
                lVar19 = 0;
                do {
                  *(undefined1 *)((long)pvVar12 + (long)*(int *)((long)pvVar14 + lVar19 * 4)) = 0;
                  lVar19 = lVar19 + 1;
                } while ((int)uVar21 != lVar19);
              }
              free(pvVar14);
              uVar21 = uVar3 - uVar21;
              local_8038[lVar10 * 8 + 1] = uVar21;
              pvVar14 = malloc((long)(int)uVar21 << 2);
              (&local_8030)[lVar10 * 4] = (long)pvVar14;
              if ((int)uVar3 < 1) {
                iVar7 = 0;
                uVar9 = 1;
              }
              else {
                iVar7 = 0;
                uVar15 = 1;
                do {
                  if (*(char *)((long)pvVar12 + uVar15) != '\0') {
                    lVar19 = (long)iVar7;
                    iVar7 = iVar7 + 1;
                    *(int *)((long)pvVar14 + lVar19 * 4) = (int)uVar15;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar9 != uVar15);
              }
              free(pvVar12);
            }
            else {
              uVar21 = local_8038[lVar10 * 8 + 1];
            }
            in_stack_ffffffffffff5f98 = (undefined4 *)CONCAT44(uVar22,iVar7);
            GmfSetLin(MshIdx_00,0x5e,local_8020[lVar10 * 4],(ulong)local_8038[lVar10 * 8],
                      (long)(int)uVar2,(ulong)uVar21,in_stack_ffffffffffff5f98);
            iVar7 = uVar21 + iVar7;
            uVar9 = uVar9 + 1;
          } while ((int)uVar9 < (int)uVar17);
          GmfSetKwd(MshIdx_00,0x5f,(long)(iVar7 + -1));
          if (0 < (int)uVar17) {
            uVar15 = 0;
            do {
              uVar9 = local_8038[uVar15 * 8 + 1];
              if (0 < (long)(int)uVar9) {
                uVar2 = local_8028[uVar15 * 8];
                lVar10 = (&local_8030)[uVar15 * 4];
                uVar3 = local_8038[uVar15 * 8];
                lVar19 = 0;
                do {
                  GmfSetLin(MshIdx_00,0x5f,(ulong)uVar2,(ulong)*(uint *)(lVar10 + lVar19 * 4),
                            (ulong)uVar3);
                  lVar19 = lVar19 + 1;
                } while ((int)uVar9 != lVar19);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar17);
          }
        }
      }
      iVar7 = GmfCloseMesh((int64_t)local_a030);
      if (iVar7 != 0) {
        iVar7 = GmfCloseMesh(MshIdx_00);
        return (uint)(iVar7 == 0);
      }
    }
  }
  return 1;
}

Assistant:

int main(int ArgCnt, char **ArgVec)
{
   int      NmbTyp, SolSiz, TypTab[ GmfMaxTyp ], FilVer = 0, InpVer, OutVer = 1;
   int      i, j, dim, MaxRef, ArgIdx = 1, NmbGrp = 0, pos, deg, NmbNod;
   int64_t  NmbLin, InpIdx, OutIdx;
   char     *InpNam, *OutNam, *PtrArg, *FlgTab;
   GrpSct   GrpTab[ MaxGrp ], *grp;
#ifndef WIN32
   float    f;
   double   d;
   int      NmbTok, NmbTok2, TokTab[ MaxTok ], TokTab2[ MaxTok ];
   char     *MshNam[ StrSiz ], *TmpStr, *TmpStr2, *TmpStr3;
#endif

   if(ArgCnt == 1)
   {
      puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
      puts(" Usage    : transmesh source_name destination_name (-options)\n");
      puts(" optional : -v output_file_version");
      puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
      puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
      puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
      puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
#ifndef WIN32
      puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
      puts("            Defines a group named \"inflow\" with index 1 that includes");
      puts("            a set of comma-seprated triangle references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
      puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
      puts("            Defines a group named \"wings\" with index 3 that excludes");
      puts("            a set of comma-seprated quadrilateral references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
#endif
      exit(0);
   }

   InpNam = ArgVec[ ArgIdx++ ];
   OutNam = ArgVec[ ArgIdx++ ];

   if(!strcmp(InpNam, OutNam))
   {
      puts("The output mesh cannot overwrite the input mesh.");
      exit(1);
   }

   memset(GmfMaxRefTab, 0, (GmfMaxKwd + 1) * sizeof(int));

   while(ArgIdx < ArgCnt)
   {
      PtrArg = ArgVec[ ArgIdx++ ];

      if(!strcmp(PtrArg, "-v"))
      {
         FilVer = atoi(ArgVec[ ArgIdx++ ]);

         if( (FilVer < 1) || (FilVer > 4) )
         {
            printf("Wrong size type : %d\n", FilVer);
            exit(1);
         }
      }
#ifndef WIN32
      if(!strcmp(PtrArg, "-igroup") || !strcmp(PtrArg, "-egroup"))
      {
         grp = &GrpTab[ NmbGrp++ ];
         grp->NfoStr = ArgVec[ ArgIdx++ ];
         grp->idx = atoi(ArgVec[ ArgIdx++ ]);
         grp->typ = GetKwdIdx(ArgVec[ ArgIdx++ ]);
         grp->NmbRef = 0;
         NmbTok = 0;
         TmpStr = ArgVec[ ArgIdx++ ];

         while( (NmbTok < MaxTok) && ((TmpStr2 = strsep(&TmpStr, ","))) )
         {
            NmbTok2 = 0;

            while( (NmbTok2 < 2) && ((TmpStr3 = strsep(&TmpStr2, "-"))) )
               TokTab2[ NmbTok2++ ] = atoi(TmpStr3);

            if(NmbTok2 == 1)
               TokTab[ NmbTok++ ] = TokTab2[0];
            else if(NmbTok2 == 2)
               for(i=TokTab2[0]; i<=TokTab2[1]; i++)
                  TokTab[ NmbTok++ ] = i;
            else
               exit(1);
         }

         grp->NmbRef = NmbTok;
         grp->RefTab = malloc(grp->NmbRef * sizeof(int));

         for(i=0;i<grp->NmbRef;i++)
            grp->RefTab[i] = TokTab[i];

         if(!strcmp(PtrArg, "-igroup"))
            grp->sgn = 1;
         else
            grp->sgn = -1;
      }
#endif
   }

   if(!(InpIdx = GmfOpenMesh(InpNam, GmfRead, &InpVer, &dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", InpNam);
      return(1);
   }

   if(FilVer)
      OutVer = FilVer;
   else
      OutVer = InpVer;

   if(!(OutIdx = GmfOpenMesh(OutNam, GmfWrite, OutVer, dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", OutNam);
      return(1);
   }

   for(i=0;i<=GmfMaxKwd;i++)
   {
      if(!strcmp(GmfKwdFmt[i][0], "Reserved") || !strcmp(GmfKwdFmt[i][0], "End"))
         continue;

      if(!GmfGotoKwd(InpIdx, i))
         continue;

      if(strcmp("i", GmfKwdFmt[i][1]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, 0);
         else
            continue;
      }
      else if(strcmp("sr", GmfKwdFmt[i][2]) && strcmp("hr", GmfKwdFmt[i][2]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, NmbLin);
         else
            continue;
      }
      else
      {
         if(!strcmp("sr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab);
            else
               continue;
         }
         else if(!strcmp("hr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab, &deg, &NmbNod)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab, deg, NmbNod);
            else
               continue;
         }
      }

      printf("Parsing %s : "INT64_T_FMT" item\n", GmfKwdFmt[i][0], NmbLin);

      for(j=1;j<=NmbLin;j++)
         GmfCpyLin(InpIdx, OutIdx, i);
   }

   if(NmbGrp)
   {
      GmfSetKwd(OutIdx, GmfIRefGroups, NmbGrp);
      pos = 1;

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         if(grp->sgn == -1)
         {
            MaxRef = GmfMaxRefTab[ grp->typ ] ? GmfMaxRefTab[ grp->typ ] : DefMaxRef;
            FlgTab = malloc(MaxRef+1);

            for(i=1;i<=MaxRef;i++)
               FlgTab[i] = 1;

            for(i=0;i<grp->NmbRef;i++)
               FlgTab[ grp->RefTab[i] ] = 0;

            free(grp->RefTab);
            grp->NmbRef = MaxRef - grp->NmbRef;
            grp->RefTab = malloc(grp->NmbRef * sizeof(int));
            pos = 0;

            for(i=1;i<=MaxRef;i++)
               if(FlgTab[i])
                  grp->RefTab[ pos++ ] = i;

            free(FlgTab);
         }

         GmfSetLin(OutIdx, GmfIRefGroups, grp->NfoStr, grp->idx, grp->typ, grp->NmbRef, pos);
         pos += grp->NmbRef;
      }

      GmfSetKwd(OutIdx, GmfDRefGroups, pos - 1);

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         for(j=0;j<grp->NmbRef;j++)
            GmfSetLin(OutIdx, GmfDRefGroups, grp->typ, grp->RefTab[j], grp->idx);
      }
   }

   if(!GmfCloseMesh(InpIdx))
      return(1);

   if(!GmfCloseMesh(OutIdx))
      return(1);

   return(0);
}